

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp,char *path,uint path_len,long mode)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  uchar *buf;
  ssize_t sVar5;
  ulong uVar6;
  char *errmsg;
  uint uVar7;
  ulong buflen;
  uchar *s;
  size_t data_len;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  uchar *local_b0;
  uchar *local_a8;
  int local_9c;
  size_t local_98;
  ulong local_90;
  char *local_88;
  ulong local_80;
  time_t local_78;
  long local_70;
  LIBSSH2_SFTP_ATTRIBUTES local_68;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_88 = path;
    local_78 = time((time_t *)0x0);
    local_80 = mode | 0x4000;
    local_90 = (ulong)path_len;
    local_9c = path_len + 0x11;
    local_70 = mode;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_68.mtime = 0;
      local_68.permissions = 0;
      local_68.atime = 0;
      local_68.uid = 0;
      local_68.gid = 0;
      local_68.flags = 0;
      local_68.filesize = 0;
      local_98 = 0;
      local_b0 = (uchar *)0x0;
      if (local_70 != -1) {
        local_68.flags = 4;
        local_68.permissions = local_80;
      }
      uVar7 = (int)local_68.flags + local_9c;
      buflen = (ulong)uVar7;
      if (sftp->mkdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        buf = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        if (buf != (uchar *)0x0) {
          local_a8 = buf;
          _libssh2_store_u32(&local_a8,uVar7 - 4);
          *local_a8 = '\x0e';
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->mkdir_request_id = uVar4;
          local_a8 = local_a8 + 1;
          _libssh2_store_u32(&local_a8,uVar4);
          _libssh2_store_str(&local_a8,local_88,local_90);
          sVar5 = sftp_attr2bin(local_a8,&local_68);
          local_a8 = local_a8 + sVar5;
          sftp->mkdir_state = libssh2_NB_state_created;
          goto LAB_00128442;
        }
        iVar3 = -6;
        errmsg = "Unable to allocate memory for FXP_MKDIR packet";
        local_a8 = (uchar *)0x0;
        goto LAB_0012858d;
      }
      buf = sftp->mkdir_packet;
LAB_00128442:
      if (sftp->mkdir_state == libssh2_NB_state_created) {
        uVar6 = _libssh2_channel_write(channel,0,buf,buflen);
        if (uVar6 == 0xffffffffffffffdb) {
          sftp->mkdir_packet = buf;
          iVar3 = -0x25;
LAB_001284d3:
          bVar2 = false;
        }
        else {
          iVar3 = (*pLVar1->free)(buf,&pLVar1->abstract);
          if (uVar6 != buflen) {
            sftp->mkdir_state = libssh2_NB_state_idle;
            iVar3 = _libssh2_error(pLVar1,-7,"_libssh2_channel_write() failed");
            goto LAB_001284d3;
          }
          sftp->mkdir_state = libssh2_NB_state_sent;
          sftp->mkdir_packet = (uchar *)0x0;
          bVar2 = true;
        }
        if (bVar2) goto LAB_001284dd;
      }
      else {
LAB_001284dd:
        iVar3 = sftp_packet_require(sftp,'e',sftp->mkdir_request_id,&local_b0,&local_98,9);
        if (iVar3 == 0) {
          sftp->mkdir_state = libssh2_NB_state_idle;
          uVar4 = _libssh2_ntohu32(local_b0 + 5);
          (*pLVar1->free)(local_b0,&pLVar1->abstract);
          if (uVar4 != 0) {
            sftp->last_errno = uVar4;
            iVar3 = -0x1f;
            errmsg = "SFTP Protocol Error";
            goto LAB_0012858d;
          }
          iVar3 = 0;
        }
        else if (iVar3 != -0x25) {
          if (iVar3 == -0x26) {
            if (local_98 != 0) {
              (*pLVar1->free)(local_b0,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            errmsg = "SFTP mkdir packet too short";
          }
          else {
            sftp->mkdir_state = libssh2_NB_state_idle;
            errmsg = "Error waiting for FXP STATUS";
          }
LAB_0012858d:
          iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
        }
      }
      if (iVar3 != -0x25) {
        return iVar3;
      }
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_78);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len, long mode)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_mkdir(sftp, path, path_len, mode));
    return rc;
}